

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlmodelserialiser.h
# Opt level: O2

void __thiscall HtmlModelSerialiser::~HtmlModelSerialiser(HtmlModelSerialiser *this)

{
  AbstractStringSerialiser::~AbstractStringSerialiser(&this->super_AbstractStringSerialiser);
  operator_delete(this,0x18);
  return;
}

Assistant:

class MODELUTILITIES_EXPORT HtmlModelSerialiser : public AbstractStringSerialiser
{
    Q_OBJECT
    Q_PROPERTY(bool printStartDocument READ printStartDocument WRITE setPrintStartDocument)
    Q_DECLARE_PRIVATE(HtmlModelSerialiser)
    Q_DISABLE_COPY(HtmlModelSerialiser)
public:
    explicit HtmlModelSerialiser(QObject *parent = Q_NULLPTR);
    HtmlModelSerialiser(QAbstractItemModel *model, QObject *parent);
    HtmlModelSerialiser(const QAbstractItemModel *model, QObject *parent);
    bool printStartDocument() const;
    void setPrintStartDocument(bool val);
    bool saveModel(QIODevice *destination) const Q_DECL_OVERRIDE;
    bool saveModel(QByteArray *destination) const Q_DECL_OVERRIDE;
    bool saveModel(QString *destination) const Q_DECL_OVERRIDE;
    bool loadModel(QString *source) Q_DECL_OVERRIDE;
    bool loadModel(QIODevice *source) Q_DECL_OVERRIDE;
    bool loadModel(const QByteArray &source) Q_DECL_OVERRIDE;

protected:
    HtmlModelSerialiser(HtmlModelSerialiserPrivate &d, QObject *parent);
}